

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

bool_t NodeFindDef(node *p,tchar_t *Token,datadef *DataDef)

{
  int iVar1;
  fourcc_t fVar2;
  bool_t bVar3;
  dataid local_28;
  dataid Id;
  datadef *DataDef_local;
  tchar_t *Token_local;
  node *p_local;
  
  if ((*Token == '_') && (bVar3 = CheckHex(Token + 1), bVar3 != 0)) {
    iVar1 = StringToInt(Token + 1,1);
    local_28 = (dataid)iVar1;
  }
  else {
    if (p == (node *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x422,"bool_t NodeFindDef(node *, const tchar_t *, datadef *)");
    }
    local_28 = (**(code **)((long)p->VMT + 0x38))(p,Token);
    if (local_28 == 0) {
      fVar2 = StringToFourCC(Token,0);
      local_28 = (dataid)fVar2;
    }
  }
  bVar3 = NodeDataDef(p,local_28,DataDef);
  return bVar3;
}

Assistant:

bool_t NodeFindDef(node* p,const tchar_t* Token,datadef* DataDef)
{
    dataid Id;
    if (Token[0]=='_' && CheckHex(Token+1))
        Id = StringToInt(Token+1,1);
    else
    {
        Id = Node_FindParam(p,Token);
        if (!Id)
            Id = StringToFourCC(Token,0);
    }
    return NodeDataDef(p,Id,DataDef);
}